

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O2

void __thiscall puppup::Game::ply(Game *this,Move m,bool fill_rack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  array<long,_32UL> *container;
  
  if (this->winner_ != -1) {
    return;
  }
  movegen::makeMove(&this->state_,(this->racks_)._M_elems + this->turn_,&this->population_,&m,
                    this->gaddag_);
  if (fill_rack) {
    container = (this->racks_)._M_elems + this->turn_;
    if (this->out_of_tiles_ == true) {
      lVar4 = 0;
      for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 8) {
        lVar4 = lVar4 + *(long *)((long)container->_M_elems + lVar3);
      }
      if (lVar4 == 0) {
        checkWinner(this);
        return;
      }
    }
    else {
      fillRack<std::array<long,32ul>>(this,container);
    }
  }
  auVar2._0_8_ = this->turn_;
  auVar2._8_8_ = (this->state_).score;
  auVar1 = vpsubq_avx((undefined1  [16])0x0,auVar2);
  auVar2 = vpblendd_avx2(auVar2 ^ ZEXT816(1),auVar1,0xc);
  this->turn_ = auVar2._0_8_;
  (this->state_).score = auVar2._8_8_;
  return;
}

Assistant:

void ply(movegen::Move m, const bool fill_rack = true) {
        if (winner_ != -1) {
            return;
        }
        movegen::makeMove(state_, racks_[turn_], population_, m, gaddag_);
        if (fill_rack) {
            if (!out_of_tiles_) {
                fillRack(racks_[turn_]);
            } else if (!std::accumulate(racks_[turn_].begin(),
                                        racks_[turn_].end(), idx(0))) {
                checkWinner();
                return;
            }
        }
        turn_ ^= 1;
        state_.score *= -1;
    }